

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBatchLoader.cpp
# Opt level: O0

void __thiscall
BatchLoaderTest_createTest_Test::~BatchLoaderTest_createTest_Test
          (BatchLoaderTest_createTest_Test *this)

{
  BatchLoaderTest_createTest_Test *this_local;
  
  ~BatchLoaderTest_createTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( BatchLoaderTest, createTest ) {
    bool ok( true );
    try {
        BatchLoader loader( m_io );
    } catch ( ... ) {
        ok = false;
    }
    EXPECT_TRUE( ok );
}